

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t read_consume_bits(archive_read *a,rar5 *rar,uint8_t *p,wchar_t n,wchar_t *value)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int iVar3;
  uint16_t v;
  
  if (L'\x10' < n) {
    return L'\xffffffe2';
  }
  wVar2 = read_bits_16(a,rar,p,&v);
  if (wVar2 == L'\0') {
    iVar3 = (rar->bits).bit_addr + n;
    pwVar1 = &(rar->bits).in_addr;
    *pwVar1 = *pwVar1 + (iVar3 >> 3);
    (rar->bits).bit_addr = (byte)iVar3 & 7;
    wVar2 = L'\0';
    if (value != (wchar_t *)0x0) {
      *value = (uint)(v >> (0x10U - (char)n & 0x1f));
    }
  }
  return wVar2;
}

Assistant:

static int read_consume_bits(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, int n, int* value)
{
	uint16_t v;
	int ret, num;

	if(n == 0 || n > 16) {
		/* This is a programmer error and should never happen
		 * in runtime. */
		return ARCHIVE_FATAL;
	}

	ret = read_bits_16(a, rar, p, &v);
	if(ret != ARCHIVE_OK)
		return ret;

	num = (int) v;
	num >>= 16 - n;

	skip_bits(rar, n);

	if(value)
		*value = num;

	return ARCHIVE_OK;
}